

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libsearch.h
# Opt level: O2

void __thiscall BuiltInTask::BuiltInTask(BuiltInTask *this,vw *vw_obj,search_task *task)

{
  search *psVar1;
  void *pvVar2;
  size_t num_actions;
  size_t local_18;
  
  SearchTask<std::vector<example_*,_std::allocator<example_*>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  ::SearchTask(&this->
                super_SearchTask<std::vector<example_*,_std::allocator<example_*>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
               ,vw_obj);
  (this->
  super_SearchTask<std::vector<example_*,_std::allocator<example_*>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  )._vptr_SearchTask = (_func_int **)&PTR__BuiltInTask_002a3da8;
  psVar1 = (this->
           super_SearchTask<std::vector<example_*,_std::allocator<example_*>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
           ).sch;
  pvVar2 = psVar1->task_data;
  local_18 = *(size_t *)((long)pvVar2 + 0x58);
  this->my_task = task;
  if (task->initialize != (_func_void_search_ptr_size_t_ptr_options_i_ptr *)0x0) {
    (*task->initialize)(psVar1,&local_18,*(options_i **)((long)pvVar2 + 0x40));
  }
  return;
}

Assistant:

BuiltInTask(vw& vw_obj, Search::search_task* task)
    : SearchTask< std::vector<example*>, vector<uint32_t> >(vw_obj)
  { HookTask::task_data* d = sch.get_task_data<HookTask::task_data>();
    size_t num_actions = d->num_actions;
    my_task = task;
    if (my_task->initialize)
      my_task->initialize(sch, num_actions, *d->arg);
  }